

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsPacket.cpp
# Opt level: O1

void __thiscall
TS_program_association_section::TS_program_association_section(TS_program_association_section *this)

{
  _Rb_tree_header *p_Var1;
  
  this->transport_stream_id = 0;
  p_Var1 = &(this->pmtPids)._M_t._M_impl.super__Rb_tree_header;
  (this->pmtPids)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->pmtPids)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->pmtPids)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->pmtPids)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->pmtPids)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->m_nitPID = -1;
  return;
}

Assistant:

TS_program_association_section::TS_program_association_section() : transport_stream_id(0)
{
    m_nitPID = -1;
    // av_crc_init(tmpAvCrc, 0, 32, 0x04c11db7, sizeof(AVCRC)*257);
}